

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void Bitmap_Operation::flipData(Image *image)

{
  bool bVar1;
  uint32_t uVar2;
  ulong __n;
  uchar *puVar3;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t rowId;
  uint8_t *end;
  uint8_t *start;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  uint32_t height;
  uint32_t rowSize;
  allocator_type *in_stack_ffffffffffffff90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  uint local_54;
  uchar *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_29;
  uint32_t local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  local_8 = in_RDI;
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if ((!bVar1) && (uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(local_8), 1 < uVar2)
     ) {
    local_c = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
    local_10 = PenguinV_Image::ImageTemplate<unsigned_char>::height(local_8);
    __n = (ulong)local_c;
    pvVar4 = &local_29;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10af41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (pvVar4,__n,in_stack_ffffffffffffff90);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10af61);
    local_48 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
    pvVar4 = local_48;
    local_50 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
    local_50 = local_50 + local_c * (local_10 - 1);
    for (local_54 = 0; local_54 < local_10 >> 1; local_54 = local_54 + 1) {
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10afd4);
      memcpy(puVar3,local_48,(ulong)local_c);
      memcpy(local_48,local_50,(ulong)local_c);
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b018);
      memcpy(local_50,puVar3,(ulong)local_c);
      local_48 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&(local_48->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + (ulong)local_c);
      local_50 = local_50 + -(ulong)local_c;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar4);
  }
  return;
}

Assistant:

void flipData( PenguinV_Image::Image & image )
    {
        if( image.empty() || image.height() < 2u )
            return;

        const uint32_t rowSize = image.rowSize();
        const uint32_t height  = image.height();

        std::vector < uint8_t > temp( rowSize );

        uint8_t * start = image.data();
        uint8_t * end   = image.data() + rowSize * (height - 1);

        for( uint32_t rowId = 0; rowId < height / 2; ++rowId, start += rowSize, end -= rowSize ) {
            memcpy( temp.data(), start, sizeof( uint8_t ) * rowSize );
            memcpy( start, end, sizeof( uint8_t ) * rowSize );
            memcpy( end, temp.data(), sizeof( uint8_t ) * rowSize );
        }
    }